

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QPolygonF * __thiscall
QGraphicsItem::mapToItem
          (QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QGraphicsItem *item,QRectF *rect)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QPointF> local_90;
  QTransform local_78;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      mapToScene(__return_storage_ptr__,this,rect);
      return __return_storage_ptr__;
    }
  }
  else {
    itemTransform(&local_78,this,item,(bool *)0x0);
    QPolygonF::QPolygonF((QPolygonF *)&local_90,(QRectF *)rect);
    QTransform::map(__return_storage_ptr__);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapToItem(const QGraphicsItem *item, const QRectF &rect) const
{
    if (item)
        return itemTransform(item).map(rect);
    return mapToScene(rect);
}